

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O3

void __thiscall
phmap::container_internal::
raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_long,std::shared_ptr<ThreadState>>,phmap::Hash<unsigned_long>,phmap::EqualTo<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::shared_ptr<ThreadState>>>>
::emplace_at<std::piecewise_construct_t_const&,std::tuple<unsigned_long_const&>,std::tuple<>>
          (raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_long,std::shared_ptr<ThreadState>>,phmap::Hash<unsigned_long>,phmap::EqualTo<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::shared_ptr<ThreadState>>>>
           *this,size_t i,piecewise_construct_t *args,tuple<const_unsigned_long_&> *args_1,
          tuple<> *args_2)

{
  undefined8 *puVar1;
  long lVar2;
  undefined1 auVar3 [16];
  long lVar4;
  iterator iVar5;
  
  lVar2 = *(long *)(this + 8);
  lVar4 = i * 0x18;
  *(unsigned_long *)(lVar2 + lVar4) =
       *(args_1->super__Tuple_impl<0UL,_const_unsigned_long_&>).
        super__Head_base<0UL,_const_unsigned_long_&,_false>._M_head_impl;
  puVar1 = (undefined8 *)(lVar2 + 8 + lVar4);
  *puVar1 = 0;
  puVar1[1] = 0;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = *(ulong *)(*(long *)(this + 8) + lVar4);
  iVar5 = raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_long,_std::shared_ptr<ThreadState>_>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<ThreadState>_>_>_>
          ::find<unsigned_long>
                    ((raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_long,_std::shared_ptr<ThreadState>_>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<ThreadState>_>_>_>
                      *)this,(key_arg<unsigned_long> *)(lVar4 + *(long *)(this + 8)),
                     SUB168(ZEXT816(0xde5fb9d2630458e9) * auVar3,8) +
                     SUB168(ZEXT816(0xde5fb9d2630458e9) * auVar3,0));
  if (iVar5.ctrl_ == (ctrl_t *)(i + *(long *)this)) {
    return;
  }
  __assert_fail("PolicyTraits::apply(FindElement{*this}, *iterator_at(i)) == iterator_at(i) && \"constructed value does not match the lookup key\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/siemens[P]drace/vendor/greg7mdp/parallel-hashmap/parallel_hashmap/phmap.h"
                ,0x802,
                "void phmap::container_internal::raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned long, std::shared_ptr<ThreadState>>, phmap::Hash<uint64_t>, phmap::EqualTo<unsigned long>, std::allocator<std::pair<const unsigned long, std::shared_ptr<ThreadState>>>>::emplace_at(size_t, Args &&...) [Policy = phmap::container_internal::FlatHashMapPolicy<unsigned long, std::shared_ptr<ThreadState>>, Hash = phmap::Hash<uint64_t>, Eq = phmap::EqualTo<unsigned long>, Alloc = std::allocator<std::pair<const unsigned long, std::shared_ptr<ThreadState>>>, Args = <const std::piecewise_construct_t &, std::tuple<const unsigned long &>, std::tuple<>>]"
               );
}

Assistant:

void emplace_at(size_t i, Args&&... args) {
        PolicyTraits::construct(&alloc_ref(), slots_ + i,
                                std::forward<Args>(args)...);

        assert(PolicyTraits::apply(FindElement{*this}, *iterator_at(i)) ==
               iterator_at(i) &&
               "constructed value does not match the lookup key");
    }